

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O1

Gia_Man_t * Gia_ManExtractWindow(Gia_Man_t *p,int LevelMax,int nTimeWindow,int fVerbose)

{
  Vec_Int_t *vOuts;
  Gia_Man_t *pGVar1;
  
  if ((LevelMax == 0) != (nTimeWindow != 0)) {
    __assert_fail("!LevelMax != !nTimeWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalMap.c"
                  ,0xf0,"Gia_Man_t *Gia_ManExtractWindow(Gia_Man_t *, int, int, int)");
  }
  vOuts = Gia_ManFindLatest(p,LevelMax,nTimeWindow);
  if (fVerbose != 0) {
    printf("Collected %d outputs to extract.\n",(ulong)(uint)vOuts->nSize);
  }
  if (vOuts->nSize != 0) {
    pGVar1 = Gia_ManExtractWin(p,vOuts,1);
    if (vOuts->pArray != (int *)0x0) {
      free(vOuts->pArray);
      vOuts->pArray = (int *)0x0;
    }
    if (vOuts != (Vec_Int_t *)0x0) {
      free(vOuts);
    }
    return pGVar1;
  }
  if (vOuts->pArray != (int *)0x0) {
    free(vOuts->pArray);
    vOuts->pArray = (int *)0x0;
  }
  if (vOuts != (Vec_Int_t *)0x0) {
    free(vOuts);
  }
  pGVar1 = Gia_ManDup(p);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManExtractWindow( Gia_Man_t * p, int LevelMax, int nTimeWindow, int fVerbose )
{
    Vec_Int_t * vOuts;
    Gia_Man_t * pWin;
    assert( !LevelMax != !nTimeWindow );
    vOuts = Gia_ManFindLatest( p, LevelMax, nTimeWindow );
    if ( fVerbose )
        printf( "Collected %d outputs to extract.\n", Vec_IntSize(vOuts) );
    if ( Vec_IntSize(vOuts) == 0 )
    {
        Vec_IntFree( vOuts );
        return Gia_ManDup( p );
    }
    pWin = Gia_ManExtractWin( p, vOuts, 1 );
    Vec_IntFree( vOuts );
    return pWin;
}